

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pstd.h
# Opt level: O1

void __thiscall
pstd::pmr::polymorphic_allocator<std::byte>::
construct<pbrt::ProjectionLight,pbrt::Transform&,pbrt::MediumHandle&,pbrt::Image,pbrt::RGBColorSpace_const*&,float&,float&,float&,pstd::pmr::polymorphic_allocator<std::byte>&>
          (polymorphic_allocator<std::byte> *this,ProjectionLight *p,Transform *args,
          MediumHandle *args_1,Image *args_2,RGBColorSpace **args_3,float *args_4,float *args_5,
          float *args_6,polymorphic_allocator<std::byte> *args_7)

{
  undefined1 auVar1 [32];
  undefined1 auVar2 [32];
  Transform renderFromLight;
  MediumInterface local_140;
  Image local_130;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 uStack_88;
  undefined8 uStack_80;
  undefined8 uStack_78;
  undefined8 uStack_70;
  undefined8 uStack_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 uStack_48;
  undefined8 uStack_40;
  undefined8 uStack_38;
  undefined8 uStack_30;
  undefined8 uStack_28;
  undefined8 uStack_20;
  
  local_98 = *(undefined8 *)(args->m).m[0];
  uStack_90 = *(undefined8 *)((args->m).m[0] + 2);
  uStack_88 = *(undefined8 *)(args->m).m[1];
  uStack_80 = *(undefined8 *)((args->m).m[1] + 2);
  uStack_78 = *(undefined8 *)(args->m).m[2];
  uStack_70 = *(undefined8 *)((args->m).m[2] + 2);
  uStack_68 = *(undefined8 *)(args->m).m[3];
  uStack_60 = *(undefined8 *)((args->m).m[3] + 2);
  local_58 = *(undefined8 *)(args->mInv).m[0];
  uStack_50 = *(undefined8 *)((args->mInv).m[0] + 2);
  uStack_48 = *(undefined8 *)(args->mInv).m[1];
  uStack_40 = *(undefined8 *)((args->mInv).m[1] + 2);
  uStack_38 = *(undefined8 *)(args->mInv).m[2];
  uStack_30 = *(undefined8 *)((args->mInv).m[2] + 2);
  uStack_28 = *(undefined8 *)(args->mInv).m[3];
  uStack_20 = *(undefined8 *)((args->mInv).m[3] + 2);
  renderFromLight = *args;
  local_140.inside =
       (MediumHandle)
       (args_1->
       super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
       ).bits;
  local_130.resolution.super_Tuple2<pbrt::Point2,_int>.y =
       (args_2->resolution).super_Tuple2<pbrt::Point2,_int>.y;
  local_130.format = args_2->format;
  local_130.resolution.super_Tuple2<pbrt::Point2,_int>.x =
       (args_2->resolution).super_Tuple2<pbrt::Point2,_int>.x;
  local_130.channelNames.alloc.memoryResource = (args_2->channelNames).alloc.memoryResource;
  local_130.channelNames.ptr = (args_2->channelNames).ptr;
  auVar1 = *(undefined1 (*) [32])&(args_2->channelNames).nAlloc;
  (args_2->channelNames).nStored = 0;
  (args_2->channelNames).ptr =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  (args_2->channelNames).nAlloc = 0;
  auVar2._0_8_ = args_2->encoding;
  auVar2._8_8_ = (args_2->p8).alloc;
  auVar2._16_8_ = (args_2->p8).ptr;
  auVar2._24_8_ = (args_2->p8).nAlloc;
  local_130._32_32_ = vperm2i128_avx2(auVar1,auVar2,0x20);
  local_130.p8.nAlloc = (args_2->p8).nAlloc;
  local_130.p8.nStored = (args_2->p8).nStored;
  local_130.p8.ptr = (args_2->p8).ptr;
  (args_2->p8).nStored = 0;
  (args_2->p8).ptr = (uchar *)0x0;
  (args_2->p8).nAlloc = 0;
  local_130.p16.alloc.memoryResource = (args_2->p16).alloc.memoryResource;
  local_130.p16.nAlloc = (args_2->p16).nAlloc;
  local_130.p16.nStored = (args_2->p16).nStored;
  local_130.p16.ptr = (args_2->p16).ptr;
  (args_2->p16).nStored = 0;
  (args_2->p16).ptr = (Half *)0x0;
  (args_2->p16).nAlloc = 0;
  local_130.p32.alloc.memoryResource = (args_2->p32).alloc.memoryResource;
  local_130.p32.nAlloc = (args_2->p32).nAlloc;
  local_130.p32.nStored = (args_2->p32).nStored;
  local_130.p32.ptr = (args_2->p32).ptr;
  (args_2->p32).nStored = 0;
  (args_2->p32).ptr = (float *)0x0;
  (args_2->p32).nAlloc = 0;
  local_140.outside.
  super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
  .bits = local_140.inside.
          super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
          .bits;
  pbrt::ProjectionLight::ProjectionLight
            (p,renderFromLight,&local_140,&local_130,*args_3,*args_4,*args_5,*args_6,
             args_7->memoryResource);
  vector<float,_pstd::pmr::polymorphic_allocator<float>_>::~vector(&local_130.p32);
  vector<pbrt::Half,_pstd::pmr::polymorphic_allocator<pbrt::Half>_>::~vector(&local_130.p16);
  vector<unsigned_char,_pstd::pmr::polymorphic_allocator<unsigned_char>_>::~vector(&local_130.p8);
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_130.channelNames);
  return;
}

Assistant:

void construct(T *p, Args &&... args) {
        ::new ((void *)p) T(std::forward<Args>(args)...);
    }